

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGenerator::WriteObjectsStrings
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *objStrings,size_type limit)

{
  cmMakefile *this_00;
  cmLocalUnixMakefileGenerator3 *this_01;
  pointer pbVar1;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *__n1;
  cmGeneratorTarget *this_02;
  int iVar2;
  cmValue cVar3;
  string *obj_1;
  cmState *obj_00;
  string *obj;
  pointer pbVar4;
  cmOutputConverter *pcVar5;
  basic_string_view<char,_std::char_traits<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ispcAdditionalObjs;
  cmMakefileTargetGeneratorObjectStrings helper;
  cmStateSnapshot local_f8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [24];
  cmMakefileTargetGeneratorObjectStrings local_b8;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_b8.Strings =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&local_b8.StateDir;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_d0 + 0x18),"CMAKE_PCH_EXTENSION","");
  cVar3 = cmMakefile::GetDefinition(this_00,(string *)(local_d0 + 0x18));
  if ((cmStateDirectory *)local_b8.Strings != &local_b8.StateDir) {
    operator_delete(local_b8.Strings,
                    (ulong)((long)&((local_b8.StateDir.DirectoryState.Tree)->Data).
                                   super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                   ._M_impl.super__Vector_impl_data + 1));
  }
  this_01 = this->LocalGenerator;
  pcVar5 = &(this_01->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (this_01 == (cmLocalUnixMakefileGenerator3 *)0x0) {
    pcVar5 = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot(&local_f8,(cmLocalGenerator *)this_01);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_e0,&local_f8);
  local_b8.CurrentString._M_dataplus._M_p = (pointer)&local_b8.CurrentString.field_2;
  local_b8.StateDir.DirectoryState.Tree =
       (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_e0._0_8_;
  local_b8.StateDir.DirectoryState.Position = local_e0._8_8_;
  local_b8.StateDir.Snapshot_.State = (cmState *)local_d0._0_8_;
  local_b8.StateDir.Snapshot_.Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_d0._8_8_;
  local_b8.StateDir.Snapshot_.Position.Position = local_d0._16_8_;
  local_b8.CurrentString._M_string_length = 0;
  local_b8.CurrentString.field_2._M_local_buf[0] = '\0';
  local_b8.NextObject._M_dataplus._M_p = (pointer)&local_b8.NextObject.field_2;
  local_b8.NextObject._M_string_length = 0;
  local_b8.NextObject.field_2._M_local_buf[0] = '\0';
  local_b8.Space = "";
  pbVar4 = (this->Objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->Objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_b8.Strings = objStrings;
  local_b8.OutputConverter = pcVar5;
  local_b8.LengthLimit = limit;
  if (pbVar4 != pbVar1) {
    do {
      local_e0._8_8_ = (pbVar4->_M_dataplus)._M_p;
      local_e0._0_8_ = pbVar4->_M_string_length;
      if (cVar3.Value == (string *)0x0) {
LAB_0050c431:
        cmMakefileTargetGeneratorObjectStrings::Feed
                  ((cmMakefileTargetGeneratorObjectStrings *)(local_d0 + 0x18),pbVar4);
      }
      else {
        __n1 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
               (cVar3.Value)->_M_string_length;
        if ((ulong)local_e0._0_8_ < __n1) goto LAB_0050c431;
        __str._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
        __str._M_len = (size_t)__n1;
        iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_e0,
                           local_e0._0_8_ - (long)__n1,(size_type)__n1,__str);
        if (iVar2 != 0) goto LAB_0050c431;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  pbVar4 = (this->ExternalObjects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->ExternalObjects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    do {
      cmMakefileTargetGeneratorObjectStrings::Feed
                ((cmMakefileTargetGeneratorObjectStrings *)(local_d0 + 0x18),pbVar4);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  this_02 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_e0,this);
  cmGeneratorTarget::GetGeneratedISPCObjects
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_f8,this_02,(string *)local_e0);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_e0._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_d0) {
    operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._0_8_ + 1));
  }
  if (local_f8.State != (cmState *)local_f8.Position.Tree) {
    obj_00 = local_f8.State;
    do {
      cmMakefileTargetGeneratorObjectStrings::Feed
                ((cmMakefileTargetGeneratorObjectStrings *)(local_d0 + 0x18),(string *)obj_00);
      obj_00 = (cmState *)
               &(obj_00->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_right;
    } while (obj_00 != (cmState *)local_f8.Position.Tree);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_b8.Strings,&local_b8.CurrentString);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.NextObject._M_dataplus._M_p != &local_b8.NextObject.field_2) {
    operator_delete(local_b8.NextObject._M_dataplus._M_p,
                    CONCAT71(local_b8.NextObject.field_2._M_allocated_capacity._1_7_,
                             local_b8.NextObject.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.CurrentString._M_dataplus._M_p != &local_b8.CurrentString.field_2) {
    operator_delete(local_b8.CurrentString._M_dataplus._M_p,
                    CONCAT71(local_b8.CurrentString.field_2._M_allocated_capacity._1_7_,
                             local_b8.CurrentString.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsStrings(
  std::vector<std::string>& objStrings, std::string::size_type limit)
{
  cmValue pchExtension = this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");

  cmMakefileTargetGeneratorObjectStrings helper(
    objStrings, this->LocalGenerator,
    this->LocalGenerator->GetStateSnapshot().GetDirectory(), limit);
  for (std::string const& obj : this->Objects) {
    if (cmHasSuffix(obj, pchExtension)) {
      continue;
    }
    helper.Feed(obj);
  }
  for (std::string const& obj : this->ExternalObjects) {
    helper.Feed(obj);
  }
  auto ispcAdditionalObjs =
    this->GeneratorTarget->GetGeneratedISPCObjects(this->GetConfigName());
  for (std::string const& obj : ispcAdditionalObjs) {
    helper.Feed(obj);
  }
  helper.Done();
}